

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_1::FixedFunctionOOB::draw(FixedFunctionOOB *this)

{
  FixedFunctionType FVar1;
  GLint bad_indices [6];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_18 = 0;
  uStack_14 = 10;
  uStack_10 = 100;
  uStack_c = 1000;
  local_8 = 0x186a000002710;
  FVar1 = (this->super_ContextReset).m_fixedFunctionType;
  if (FVar1 != FIXEDFUNCTIONTYPE_VERTICES) {
    if (FVar1 == FIXEDFUNCTIONTYPE_INDICES) {
      (*((this->super_ContextReset).m_gl)->drawElements)(4,6,0x1405,&local_18);
    }
    return;
  }
  (*((this->super_ContextReset).m_gl)->drawArrays)(4,0,1000);
  return;
}

Assistant:

void FixedFunctionOOB::draw (void)
{
	const glw::GLint bad_indices[] = {0, 10, 100, 1000, 10000, 100000};

	if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_INDICES)
		m_gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_INT, bad_indices);
	else if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_VERTICES)
		m_gl.drawArrays(GL_TRIANGLES, 0, 1000);
	else
		DE_FATAL("Unknown fixed function type");
}